

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall application::Chat::moveCursor(Chat *this,int x,int y)

{
  wostream *pwVar1;
  char *pcVar2;
  
  if (x < 1) {
    if (-1 < x) goto LAB_0014b2ff;
    pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,-x);
    pcVar2 = "D";
  }
  else {
    pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,x);
    pcVar2 = "C";
  }
  std::operator<<(pwVar1,pcVar2);
LAB_0014b2ff:
  if (y < 1) {
    if (-1 < y) {
      return;
    }
    pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,-y);
    pcVar2 = "B";
  }
  else {
    pwVar1 = std::operator<<((wostream *)&std::wcout,"\x1b[");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,y);
    pcVar2 = "A";
  }
  std::operator<<(pwVar1,pcVar2);
  return;
}

Assistant:

void Chat::moveCursor(const int x, const int y)
{
#ifdef _WIN32
	CONSOLE_SCREEN_BUFFER_INFO sbi;
	COORD position;
	GetConsoleScreenBufferInfo(GetStdHandle(STD_OUTPUT_HANDLE), &sbi);
	position.X = sbi.dwCursorPosition.X + x;
	position.Y = sbi.dwCursorPosition.Y - y;
	SetConsoleCursorPosition(GetStdHandle(STD_OUTPUT_HANDLE), position);
#else
	if (x > 0)
		std::wcout << "\033[" << x << "C";
	else if (x < 0)
		std::wcout << "\033[" << abs(x) << "D";

	if (y > 0)
		std::wcout << "\033[" << y << "A";
	else if (y < 0)
		std::wcout << "\033[" << abs(y) << "B";
#endif
}